

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
nigel::Lexer::splitToken
          (Lexer *this,String *identifier,size_t index,iterator *token,
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
          *lexerStruct)

{
  list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>> *plVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Token_Operator *pTVar3;
  _Node *p_Var4;
  shared_ptr<nigel::Token> tmp1;
  undefined1 local_81;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  shared_ptr<nigel::Token> local_58;
  Token_Operator *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>> *local_38;
  
  std::__cxx11::string::substr((ulong)&local_78,(ulong)identifier);
  local_48 = (Token_Operator *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::Token_Operator,std::allocator<nigel::Token_Operator>,std::__cxx11::string>
            (&_Stack_40,&local_48,(allocator<nigel::Token_Operator> *)&local_81,&local_78);
  std::__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::Token_Operator,nigel::Token_Operator>
            ((__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2> *)&local_48,local_48);
  local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Token;
  local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_40._M_pi;
  local_48 = (Token_Operator *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)identifier);
  local_48 = (Token_Operator *)0x0;
  local_38 = (list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>> *)
             lexerStruct;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::Token_Operator,std::allocator<nigel::Token_Operator>,std::__cxx11::string>
            (&_Stack_40,&local_48,(allocator<nigel::Token_Operator> *)&local_81,&local_78);
  std::__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::Token_Operator,nigel::Token_Operator>
            ((__shared_ptr<nigel::Token_Operator,(__gnu_cxx::_Lock_policy)2> *)&local_48,local_48);
  pTVar3 = local_48;
  local_80 = _Stack_40._M_pi;
  local_48 = (Token_Operator *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = token->_M_node[1]._M_next;
  ((Token *)
  &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token)->
  columnNo = (size_t)p_Var2[2]._M_prev;
  ((Token *)
  &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token)->
  lineNo = (size_t)p_Var2[2]._M_next;
  (((Token *)
   &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token)->
  line).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)p_Var2[3]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((Token *)
               &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Token)->line).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  (((Token *)
   &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token)->
  path).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p_Var2[4]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((Token *)
               &(local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Token)->path).
              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[4]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  (pTVar3->super_Token).columnNo = (long)&(p_Var2[2]._M_prev)->_M_next + index;
  (pTVar3->super_Token).lineNo = (size_t)p_Var2[2]._M_next;
  (pTVar3->super_Token).line.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)p_Var2[3]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pTVar3->super_Token).line.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_prev);
  p_Var2 = token->_M_node[1]._M_next;
  (pTVar3->super_Token).path.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)p_Var2[4]._M_next;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pTVar3->super_Token).path.
              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[4]._M_prev);
  Token::as<nigel::Token_Operator>((Token *)&local_78);
  plVar1 = local_38;
  std::__cxx11::string::_M_assign((string *)identifier);
  if ((element_type *)local_78._M_string_length != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
  }
  p_Var4 = std::__cxx11::
           list<std::shared_ptr<nigel::Token>,std::allocator<std::shared_ptr<nigel::Token>>>::
           _M_create_node<std::shared_ptr<nigel::Token>const&>(plVar1,&local_58);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  plVar1 = plVar1 + 0x10;
  *(long *)plVar1 = *(long *)plVar1 + 1;
  p_Var2 = token->_M_node;
  p_Var2[1]._M_next = (_List_node_base *)pTVar3;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
  p_Var2[1]._M_prev = (_List_node_base *)local_80;
  token->_M_node = token->_M_node->_M_prev;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void Lexer::splitToken( String &identifier, size_t index, std::list<std::shared_ptr<Token>>::iterator &token, std::list<std::shared_ptr<Token>> &lexerStruct )
	{
		std::shared_ptr<Token> tmp1 = std::make_shared<Token_Operator>( identifier.substr( 0, index ) );
		std::shared_ptr<Token> tmp2 = std::make_shared<Token_Operator>( identifier.substr( index ) );

		tmp1->columnNo = ( *token )->columnNo;
		tmp1->lineNo = ( *token )->lineNo;
		tmp1->line = ( *token )->line;
		tmp1->path = ( *token )->path;
		tmp2->columnNo = ( *token )->columnNo + index;
		tmp2->lineNo = ( *token )->lineNo;
		tmp2->line = ( *token )->line;
		tmp2->path = ( *token )->path;

		identifier = tmp1->as<Token_Operator>()->operatorToken;
		lexerStruct.insert( token, tmp1 );
		token->swap( tmp2 );
		token--;
	}